

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.h
# Opt level: O3

void __thiscall
nodecpp::iibmalloc::
CollectionInPages<nodecpp::iibmalloc::PageAllocatorWithCaching,_nodecpp::iibmalloc::SoundingAddressPageAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_6UL,_23UL,_4UL,_3UL>::PageBlockDescriptor>
::deinitialize(CollectionInPages<nodecpp::iibmalloc::PageAllocatorWithCaching,_nodecpp::iibmalloc::SoundingAddressPageAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_6UL,_23UL,_4UL,_3UL>::PageBlockDescriptor>
               *this)

{
  ListItem *pLVar1;
  ListItem *pLVar2;
  size_t sVar3;
  ListItem *tmp;
  ListItem *block;
  
  pLVar1 = this->head;
  block = (ListItem *)0x0;
  while (pLVar2 = pLVar1, pLVar2 != (ListItem *)0x0) {
    pLVar1 = pLVar2->next;
    if (((ulong)pLVar2 & 0xfff) == 0) {
      pLVar2->next = block;
      block = pLVar2;
    }
  }
  pLVar1 = this->freeList;
  while (pLVar2 = pLVar1, pLVar2 != (ListItem *)0x0) {
    pLVar1 = pLVar2->next;
    if (((ulong)pLVar2 & 0xfff) == 0) {
      pLVar2->next = block;
      block = pLVar2;
    }
  }
  if (block == (ListItem *)0x0) {
    sVar3 = this->pageCnt;
  }
  else {
    do {
      pLVar1 = block->next;
      PageAllocatorWithCaching::freeChunkNoCache(&this->super_PageAllocatorWithCaching,block,0x1000)
      ;
      sVar3 = this->pageCnt - 1;
      this->pageCnt = sVar3;
      block = pLVar1;
    } while (pLVar1 != (ListItem *)0x0);
  }
  if (sVar3 != 0) {
    assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
               ,0x9d,"pageCnt == 0",true);
  }
  this->head = (ListItem *)0x0;
  this->freeList = (ListItem *)0x0;
  return;
}

Assistant:

void deinitialize()
	{
		ListItem* pageStartHead = nullptr;
		collectPageStarts( &pageStartHead, head );
		collectPageStarts( &pageStartHead, freeList );
		while (pageStartHead)
		{
			ListItem* tmp = pageStartHead->next;
			this->freeChunkNoCache( pageStartHead, PAGE_SIZE_BYTES );
			--pageCnt;
			pageStartHead = tmp;
		}
		NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, pageCnt == 0 );
		head = nullptr;
		freeList = nullptr;
	}